

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

IPAsKey * __thiscall
BinHash<IPAsKey>::DoInsert(BinHash<IPAsKey> *this,IPAsKey *key,bool need_alloc,bool *stored)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  IPAsKey **ppIVar5;
  IPAsKey *pIVar6;
  
  *stored = false;
  pIVar6 = (IPAsKey *)0x0;
  if ((key != (IPAsKey *)0x0) && (this->tableSize != 0)) {
    uVar3 = IPAsKey::Hash(key);
    uVar1 = (ulong)uVar3 % (ulong)this->tableSize;
    ppIVar5 = this->hashBin + uVar1;
    while (pIVar6 = *ppIVar5, pIVar6 != (IPAsKey *)0x0) {
      bVar2 = IPAsKey::IsSameKey(key,pIVar6);
      if (bVar2) {
        (*pIVar6->_vptr_IPAsKey[3])(pIVar6,key);
        *stored = false;
        return pIVar6;
      }
      ppIVar5 = &pIVar6->HashNext;
    }
    pIVar6 = key;
    if (need_alloc) {
      iVar4 = (*key->_vptr_IPAsKey[2])(key);
      pIVar6 = (IPAsKey *)CONCAT44(extraout_var,iVar4);
    }
    if (pIVar6 == (IPAsKey *)0x0) {
      pIVar6 = (IPAsKey *)0x0;
    }
    else {
      ppIVar5 = this->hashBin;
      pIVar6->HashNext = ppIVar5[uVar1];
      ppIVar5[uVar1] = pIVar6;
      *stored = true;
      this->tableCount = this->tableCount + 1;
    }
  }
  return pIVar6;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }